

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_msmblur.h
# Opt level: O3

void __thiscall
embree::avx::BVHBuilderMSMBlur::
BuilderT<embree::NodeRefPtr<8>,_embree::avx::RecalculatePrimRef<embree::Instance>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<8>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<8>,_8>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<8>,_8>::Set,_embree::avx::CreateMSMBlurLeaf<8,_embree::Instance,_embree::InstancePrimitive>,_embree::Scene::BuildProgressMonitorInterface>
::splitFallback(BuilderT<embree::NodeRefPtr<8>,_embree::avx::RecalculatePrimRef<embree::Instance>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<8>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<8>,_8>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<8>,_8>::Set,_embree::avx::CreateMSMBlurLeaf<8,_embree::Instance,_embree::InstancePrimitive>,_embree::Scene::BuildProgressMonitorInterface>
                *this,SetMB *set,SetMB *lset,SetMB *rset)

{
  PrimRefVector pmVar1;
  ulong uVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  long lVar5;
  size_t sVar6;
  undefined8 unaff_RBP;
  long lVar7;
  ulong uVar8;
  size_t sVar9;
  undefined4 uVar10;
  ulong uVar11;
  undefined4 uVar12;
  BBox1f *pBVar13;
  ulong uVar14;
  size_t sVar15;
  ulong uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [64];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar36;
  undefined1 local_d8 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_c8;
  undefined1 local_b8 [16];
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  
  pmVar1 = set->prims;
  uVar2 = (set->super_PrimInfoMB).object_range._begin;
  uVar3 = (set->super_PrimInfoMB).object_range._end;
  uVar8 = uVar2 + uVar3 + 1 >> 1;
  local_b8 = SUB6416(ZEXT464(0x3f800000),0);
  local_d8 = ZEXT816(0x3f80000000000000);
  auVar26._8_4_ = 0x7f800000;
  auVar26._0_8_ = 0x7f8000007f800000;
  auVar26._12_4_ = 0x7f800000;
  local_c8.m128[2] = -INFINITY;
  local_c8._0_8_ = 0xff800000ff800000;
  local_c8.m128[3] = -INFINITY;
  lVar5 = uVar8 - uVar2;
  if (uVar8 < uVar2 || lVar5 == 0) {
    uVar11 = 0;
    sVar9 = 0;
    auVar28._8_4_ = 0xff800000;
    auVar28._0_8_ = 0xff800000ff800000;
    auVar28._12_4_ = 0xff800000;
    auVar27 = ZEXT816(0x3f80000000000000);
    auVar29 = SUB6416(ZEXT464(0x3f800000),0);
    auVar35 = auVar28;
    auVar31 = auVar26;
    auVar32 = auVar26;
    auVar20 = auVar28;
    auVar25 = auVar26;
  }
  else {
    uVar11 = uVar2 * 0x50;
    pBVar13 = &pmVar1->items[uVar2].time_range;
    auVar30 = ZEXT464(0x3f800000);
    auVar27 = ZEXT816(0x3f80000000000000);
    auVar28._8_4_ = 0xff800000;
    auVar28._0_8_ = 0xff800000ff800000;
    auVar28._12_4_ = 0xff800000;
    auVar31._8_4_ = 0x7f800000;
    auVar31._0_8_ = 0x7f8000007f800000;
    auVar31._12_4_ = 0x7f800000;
    sVar9 = 0;
    uVar14 = 0;
    auVar35 = auVar28;
    auVar20 = auVar28;
    auVar32 = auVar31;
    auVar25 = auVar31;
    do {
      auVar29 = *(undefined1 (*) [16])&pBVar13[-8].lower;
      auVar23 = *(undefined1 (*) [16])(pBVar13 + -6);
      auVar34 = *(undefined1 (*) [16])(pBVar13 + -4);
      auVar22 = *(undefined1 (*) [16])(pBVar13 + -2);
      auVar17._0_4_ =
           auVar29._0_4_ * 0.5 + auVar34._0_4_ * 0.5 + auVar23._0_4_ * 0.5 + auVar22._0_4_ * 0.5;
      auVar17._4_4_ =
           auVar29._4_4_ * 0.5 + auVar34._4_4_ * 0.5 + auVar23._4_4_ * 0.5 + auVar22._4_4_ * 0.5;
      auVar17._8_4_ =
           auVar29._8_4_ * 0.5 + auVar34._8_4_ * 0.5 + auVar23._8_4_ * 0.5 + auVar22._8_4_ * 0.5;
      auVar17._12_4_ =
           auVar29._12_4_ * 0.5 + auVar34._12_4_ * 0.5 + auVar23._12_4_ * 0.5 + auVar22._12_4_ * 0.5
      ;
      auVar32 = vminps_avx(auVar32,auVar29);
      auVar20 = vmaxps_avx(auVar20,auVar23);
      auVar31 = vminps_avx(auVar31,auVar34);
      auVar35 = vmaxps_avx(auVar35,auVar22);
      auVar21._8_8_ = 0;
      auVar21._0_4_ = pBVar13->lower;
      auVar21._4_4_ = pBVar13->upper;
      auVar29 = auVar30._0_16_;
      auVar23 = vcmpps_avx(auVar29,auVar21,1);
      auVar4 = vinsertps_avx(auVar29,auVar21,0x50);
      auVar29 = vblendps_avx(auVar21,auVar29,2);
      auVar29 = vblendvps_avx(auVar29,auVar4,auVar23);
      auVar30 = ZEXT1664(auVar29);
      auVar25 = vminps_avx(auVar25,auVar17);
      uVar12 = (undefined4)(uVar11 >> 0x20);
      uVar10 = vextractps_avx(auVar34,3);
      sVar9 = sVar9 + CONCAT44(uVar12,uVar10);
      uVar10 = vextractps_avx(auVar22,3);
      uVar11 = CONCAT44(uVar12,uVar10);
      unaff_RBP = CONCAT71((int7)((ulong)unaff_RBP >> 8),uVar14 < uVar11);
      if (uVar11 < uVar14) {
        uVar11 = uVar14;
      }
      auVar23 = vpshufd_avx(ZEXT416((uint)unaff_RBP),0x50);
      auVar23 = vpslld_avx(auVar23,0x1f);
      auVar27 = vblendvps_avx(auVar27,auVar21,auVar23);
      auVar28 = vmaxps_avx(auVar28,auVar17);
      pBVar13 = pBVar13 + 10;
      lVar5 = lVar5 + -1;
      uVar14 = uVar11;
    } while (lVar5 != 0);
  }
  lVar5 = uVar3 - uVar8;
  if (uVar3 < uVar8 || lVar5 == 0) {
    uVar14 = 0;
    sVar6 = 0;
    aVar33.m128[2] = -INFINITY;
    aVar33._0_8_ = 0xff800000ff800000;
    aVar33.m128[3] = -INFINITY;
    auVar23 = auVar26;
    aVar36 = aVar33;
    auVar34 = auVar26;
  }
  else {
    pBVar13 = &pmVar1->items[uVar8].time_range;
    local_b8 = SUB6416(ZEXT464(0x3f800000),0);
    local_d8 = ZEXT816(0x3f80000000000000);
    aVar33.m128[2] = -INFINITY;
    aVar33._0_8_ = 0xff800000ff800000;
    aVar33.m128[3] = -INFINITY;
    auVar34._8_4_ = 0x7f800000;
    auVar34._0_8_ = 0x7f8000007f800000;
    auVar34._12_4_ = 0x7f800000;
    sVar6 = 0;
    uVar14 = 0;
    sVar15 = uVar8 * 0x50;
    auVar26 = auVar34;
    aVar36 = aVar33;
    auVar23 = auVar34;
    local_c8 = aVar33;
    do {
      auVar22 = *(undefined1 (*) [16])&pBVar13[-8].lower;
      auVar4 = *(undefined1 (*) [16])(pBVar13 + -6);
      auVar17 = *(undefined1 (*) [16])(pBVar13 + -4);
      auVar21 = *(undefined1 (*) [16])(pBVar13 + -2);
      auVar24._0_4_ =
           auVar22._0_4_ * 0.5 + auVar17._0_4_ * 0.5 + auVar4._0_4_ * 0.5 + auVar21._0_4_ * 0.5;
      auVar24._4_4_ =
           auVar22._4_4_ * 0.5 + auVar17._4_4_ * 0.5 + auVar4._4_4_ * 0.5 + auVar21._4_4_ * 0.5;
      auVar24._8_4_ =
           auVar22._8_4_ * 0.5 + auVar17._8_4_ * 0.5 + auVar4._8_4_ * 0.5 + auVar21._8_4_ * 0.5;
      auVar24._12_4_ =
           auVar22._12_4_ * 0.5 + auVar17._12_4_ * 0.5 + auVar4._12_4_ * 0.5 + auVar21._12_4_ * 0.5;
      auVar26 = vminps_avx(auVar26,auVar22);
      aVar33.m128 = (__m128)vmaxps_avx(aVar33.m128,auVar4);
      auVar23 = vminps_avx(auVar23,auVar17);
      aVar36.m128 = (__m128)vmaxps_avx(aVar36.m128,auVar21);
      auVar18._8_8_ = 0;
      auVar18._0_4_ = pBVar13->lower;
      auVar18._4_4_ = pBVar13->upper;
      auVar4 = vcmpps_avx(local_b8,auVar18,1);
      auVar19 = vinsertps_avx(local_b8,auVar18,0x50);
      auVar22 = vblendps_avx(auVar18,local_b8,2);
      local_b8 = vblendvps_avx(auVar22,auVar19,auVar4);
      uVar10 = vextractps_avx(auVar17,3);
      lVar7 = CONCAT44((int)((ulong)unaff_RBP >> 0x20),uVar10);
      uVar10 = vextractps_avx(auVar21,3);
      uVar16 = CONCAT44((int)(sVar15 >> 0x20),uVar10);
      sVar6 = sVar6 + lVar7;
      unaff_RBP = CONCAT71((int7)((ulong)lVar7 >> 8),uVar14 < uVar16);
      auVar22 = vpshufd_avx(ZEXT416((uint)unaff_RBP),0x50);
      auVar22 = vpslld_avx(auVar22,0x1f);
      local_d8 = vblendvps_avx(local_d8,auVar18,auVar22);
      auVar34 = vminps_avx(auVar34,auVar24);
      if (uVar16 < uVar14) {
        uVar16 = uVar14;
      }
      uVar14 = uVar16;
      local_c8.m128 = (__m128)vmaxps_avx(local_c8.m128,auVar24);
      pBVar13 = pBVar13 + 10;
      lVar5 = lVar5 + -1;
      sVar15 = uVar14;
    } while (lVar5 != 0);
  }
  auVar19._8_8_ = 0;
  auVar19._0_4_ = (set->super_PrimInfoMB).time_range.lower;
  auVar19._4_4_ = (set->super_PrimInfoMB).time_range.upper;
  auVar4 = vcmpps_avx(auVar29,auVar19,1);
  auVar22 = vblendps_avx(auVar19,auVar29,2);
  auVar29 = vinsertps_avx(auVar29,auVar19,0x50);
  auVar29 = vblendvps_avx(auVar29,auVar22,auVar4);
  local_68 = auVar32._0_8_;
  uStack_60 = auVar32._8_8_;
  *(undefined8 *)
   &(lset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower
    .field_0 = local_68;
  *(undefined8 *)
   ((long)&(lset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
           bounds0.lower.field_0 + 8) = uStack_60;
  local_58 = auVar20._0_8_;
  uStack_50 = auVar20._8_8_;
  *(undefined8 *)
   &(lset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper
    .field_0 = local_58;
  *(undefined8 *)
   ((long)&(lset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
           bounds0.upper.field_0 + 8) = uStack_50;
  local_a8 = auVar31._0_8_;
  uStack_a0 = auVar31._8_8_;
  *(undefined8 *)
   &(lset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower
    .field_0 = local_a8;
  *(undefined8 *)
   ((long)&(lset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
           bounds1.lower.field_0 + 8) = uStack_a0;
  local_98 = auVar35._0_8_;
  uStack_90 = auVar35._8_8_;
  *(undefined8 *)
   &(lset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper
    .field_0 = local_98;
  *(undefined8 *)
   ((long)&(lset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
           bounds1.upper.field_0 + 8) = uStack_90;
  local_88 = auVar25._0_8_;
  uStack_80 = auVar25._8_8_;
  *(undefined8 *)
   &(lset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0
       = local_88;
  *(undefined8 *)
   ((long)&(lset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
           field_0 + 8) = uStack_80;
  local_78 = auVar28._0_8_;
  uStack_70 = auVar28._8_8_;
  *(undefined8 *)
   &(lset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0
       = local_78;
  *(undefined8 *)
   ((long)&(lset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.
           field_0 + 8) = uStack_70;
  (lset->super_PrimInfoMB).num_time_segments = sVar9;
  (lset->super_PrimInfoMB).max_num_time_segments = uVar11;
  auVar29 = vmovlhps_avx(auVar27,auVar29);
  (lset->super_PrimInfoMB).max_time_range.lower = (float)(int)auVar29._0_8_;
  (lset->super_PrimInfoMB).max_time_range.upper = (float)(int)((ulong)auVar29._0_8_ >> 0x20);
  (lset->super_PrimInfoMB).time_range.lower = (float)(int)auVar29._8_8_;
  (lset->super_PrimInfoMB).time_range.upper = (float)(int)((ulong)auVar29._8_8_ >> 0x20);
  lset->prims = pmVar1;
  (lset->super_PrimInfoMB).object_range._begin = uVar2;
  (lset->super_PrimInfoMB).object_range._end = uVar8;
  auVar20._8_8_ = 0;
  auVar20._0_4_ = (set->super_PrimInfoMB).time_range.lower;
  auVar20._4_4_ = (set->super_PrimInfoMB).time_range.upper;
  auVar27 = vcmpps_avx(local_b8,auVar20,1);
  auVar29 = vblendps_avx(auVar20,local_b8,2);
  auVar20 = vinsertps_avx(local_b8,auVar20,0x50);
  auVar29 = vblendvps_avx(auVar20,auVar29,auVar27);
  pmVar1 = set->prims;
  *(undefined1 (*) [16])
   (rset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
   field_0.m128 = auVar26;
  (rset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.
  field_0 = aVar33;
  *(undefined1 (*) [16])
   (rset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.
   field_0.m128 = auVar23;
  (rset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.
  field_0 = aVar36;
  *(undefined1 (*) [16])
   (rset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.
   m128 = auVar34;
  *(undefined8 *)
   &(rset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0
       = local_c8._0_8_;
  *(undefined8 *)
   ((long)&(rset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.
           field_0 + 8) = local_c8._8_8_;
  auVar26 = vmovlhps_avx(local_d8,auVar29);
  (rset->super_PrimInfoMB).num_time_segments = sVar6;
  (rset->super_PrimInfoMB).max_num_time_segments = uVar14;
  (rset->super_PrimInfoMB).max_time_range.lower = (float)(int)auVar26._0_8_;
  (rset->super_PrimInfoMB).max_time_range.upper = (float)(int)((ulong)auVar26._0_8_ >> 0x20);
  (rset->super_PrimInfoMB).time_range.lower = (float)(int)auVar26._8_8_;
  (rset->super_PrimInfoMB).time_range.upper = (float)(int)((ulong)auVar26._8_8_ >> 0x20);
  rset->prims = pmVar1;
  (rset->super_PrimInfoMB).object_range._begin = uVar8;
  (rset->super_PrimInfoMB).object_range._end = uVar3;
  return;
}

Assistant:

void splitFallback(const SetMB& set, SetMB& lset, SetMB& rset)
          {
            mvector<PrimRefMB>& prims = *set.prims;

            const size_t begin = set.begin();
            const size_t end   = set.end();
            const size_t center = (begin + end + 1) / 2;

            PrimInfoMB linfo = empty;
            for (size_t i=begin; i<center; i++)
              linfo.add_primref(prims[i]);

            PrimInfoMB rinfo = empty;
            for (size_t i=center; i<end; i++)
              rinfo.add_primref(prims[i]);

            new (&lset) SetMB(linfo,set.prims,range<size_t>(begin,center),set.time_range);
            new (&rset) SetMB(rinfo,set.prims,range<size_t>(center,end  ),set.time_range);
          }